

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::TcpSocketEngine::WaitForRead(TcpSocketEngine *this,int msec,bool *timedOut)

{
  int iVar1;
  undefined1 *in_RDX;
  long in_RDI;
  int ret;
  bool in_stack_000000a3;
  int in_stack_000000a4;
  TcpSocketEngine *in_stack_000000a8;
  
  *in_RDX = 0;
  iVar1 = nativeSelect(in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  if (iVar1 == 0) {
    *in_RDX = 1;
    *(undefined4 *)(in_RDI + 0x4c) = 5;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x58),"socket timed out");
  }
  return 0 < iVar1;
}

Assistant:

bool TcpSocketEngine::WaitForRead(int msec, bool* timedOut) {

    // reset timedOut flag
    *timedOut = false;

    // need to wait for our socket to be ready to read
    const int ret = nativeSelect(msec, true);

    // if timed out
    if ( ret == 0 ) {
        *timedOut = true;
        m_socketError = TcpSocket::SocketTimeoutError;
        m_errorString = "socket timed out";
    }

    // return if any sockets available for reading
    return ( ret > 0 );
}